

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void glist_readatoms(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,t_symbol *templatesym,t_word *w
                    ,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  _binbuf *x_00;
  _array *p_Var2;
  uint uVar3;
  t_template *ptVar4;
  _binbuf *x_01;
  long lVar5;
  t_atom *ptVar6;
  t_atomtype natoms_00;
  int iVar7;
  _glist *x_02;
  long lVar8;
  undefined4 in_register_00000034;
  t_atom *vec_00;
  ulong uVar9;
  t_atomtype tVar10;
  t_atomtype tVar11;
  long lVar12;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_ffffffffffffff70;
  int message;
  t_symbol *local_70;
  ulong local_68;
  long local_60;
  t_template *local_58;
  ulong local_50;
  t_symbol *local_48;
  long local_40;
  _array *local_38;
  
  vec_00 = (t_atom *)CONCAT44(in_register_00000034,natoms);
  x_02 = (_glist *)((ulong)x & 0xffffffff);
  ptVar4 = template_findbyname((t_symbol *)p_nextmsg);
  natoms_00 = (t_atomtype)x;
  if (ptVar4 == (t_template *)0x0) {
    pd_error((void *)0x0,"%s: no such template",*(undefined8 *)p_nextmsg);
    vec->a_type = natoms_00;
  }
  else {
    local_70 = templatesym;
    word_restore((t_word *)templatesym,ptVar4,(int)w,(t_atom *)CONCAT44(in_stack_0000000c,argc));
    local_60 = (long)(int)natoms_00;
    uVar3 = ptVar4->t_n;
    if (ptVar4->t_n < 1) {
      uVar3 = 0;
    }
    local_50 = (ulong)uVar3;
    uVar9 = 0;
    local_58 = ptVar4;
    while (lVar12 = local_60, uVar9 != local_50) {
      iVar7 = local_58->t_vec[uVar9].ds_type;
      local_68 = uVar9;
      if (iVar7 == 2) {
        x_01 = binbuf_new();
        ptVar1 = local_70;
        tVar11 = vec->a_type;
        lVar5 = (long)(int)tVar11;
        tVar10 = (t_atomtype)x_02;
        if ((int)(t_atomtype)x_02 < (int)tVar11) {
          tVar10 = tVar11;
        }
        ptVar6 = vec_00 + lVar5;
        for (lVar8 = lVar5; lVar8 < lVar12; lVar8 = lVar8 + 1) {
          if (ptVar6->a_type == A_SEMI) {
            tVar10 = (t_atomtype)lVar8;
            break;
          }
          ptVar6 = ptVar6 + 1;
        }
        binbuf_restore(x_01,tVar10 - tVar11,vec_00 + lVar5);
        x_00 = (_binbuf *)(&ptVar1->s_name)[uVar9];
        iVar7 = binbuf_getnatom(x_01);
        ptVar6 = binbuf_getvec(x_01);
        binbuf_add(x_00,iVar7,ptVar6);
        binbuf_free(x_01);
        x_02 = (_glist *)(ulong)natoms_00;
        tVar11 = tVar10 + A_FLOAT;
        if (lVar12 <= lVar8) {
          tVar11 = natoms_00;
        }
        vec->a_type = tVar11;
        tVar11 = natoms_00;
      }
      else {
        tVar11 = natoms_00;
        if (iVar7 == 3) {
          local_38 = (_array *)(&local_70->s_name)[uVar9];
          local_40 = (long)local_38->a_elemsize;
          ptVar1 = local_58->t_vec[uVar9].ds_arraytemplate;
          ptVar4 = template_findbyname(ptVar1);
          if (ptVar4 == (t_template *)0x0) {
            pd_error((void *)0x0,"%s: no such template",ptVar1->s_name);
            x_02 = (_glist *)(ulong)natoms_00;
            tVar11 = natoms_00;
          }
          else {
            iVar7 = 1;
            lVar12 = 0;
            x_02 = (_glist *)(ulong)natoms_00;
            tVar11 = natoms_00;
            local_48 = ptVar1;
            while( true ) {
              uVar3 = canvas_scanbinbuf(natoms_00,vec_00,&message,(int *)vec);
              p_Var2 = local_38;
              if (uVar3 == 0) break;
              array_resize(local_38,iVar7);
              glist_readatoms(x_02,natoms,vec,(int *)local_48,(t_symbol *)(p_Var2->a_vec + lVar12),
                              (t_word *)(ulong)uVar3,message * 0x10 + natoms,
                              (t_atom *)CONCAT44(tVar11,in_stack_ffffffffffffff70));
              lVar12 = lVar12 + local_40;
              iVar7 = iVar7 + 1;
            }
          }
        }
      }
      natoms_00 = tVar11;
      uVar9 = local_68 + 1;
    }
  }
  return;
}

Assistant:

static void glist_readatoms(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, t_symbol *templatesym, t_word *w, int argc, t_atom *argv)
{
    int message, n, i;

    t_template *template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "%s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return;
    }
    word_restore(w, template, argc, argv);
    n = template->t_n;
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = 0;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            t_template *arraytemplate =
                template_findbyname(arraytemplatesym);
            if (!arraytemplate)
            {
                pd_error(0, "%s: no such template", arraytemplatesym->s_name);
            }
            else while (1)
            {
                t_word *element;
                int nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
                    /* empty line terminates array */
                if (!nline)
                    break;
                array_resize(a, nitems + 1);
                element = (t_word *)(((char *)a->a_vec) +
                    nitems * elemsize);
                glist_readatoms(x, natoms, vec, p_nextmsg, arraytemplatesym,
                    element, nline, vec + message);
                nitems++;
            }
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
        {
            t_binbuf *z = binbuf_new();
            int first = *p_nextmsg, last;
            for (last = first; last < natoms && vec[last].a_type != A_SEMI;
                last++);
            binbuf_restore(z, last-first, vec+first);
            binbuf_add(w[i].w_binbuf, binbuf_getnatom(z), binbuf_getvec(z));
            binbuf_free(z);
            last++;
            if (last > natoms) last = natoms;
            *p_nextmsg = last;
        }
    }
}